

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestMessageEnum::Clear(TestMessageEnum *this)

{
  uint32_t cached_has_bits;
  TestMessageEnum *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.redactable_enum_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMessageEnum::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestMessageEnum)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.redactable_enum_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}